

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

QObject ** __thiscall
QHash<QObject_*,_QString>::keyImpl(QHash<QObject_*,_QString> *this,QString *value)

{
  Span *pSVar1;
  bool bVar2;
  Entry *pEVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  piter local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->d != (Data *)0x0) {
    local_28 = (piter)begin(this);
    while( true ) {
      if (local_28.d == (Data<QHashPrivate::Node<QObject_*,_QString>_> *)0x0 && local_28.bucket == 0
         ) break;
      pSVar1 = (local_28.d)->spans;
      uVar4 = local_28.bucket >> 7;
      bVar2 = ::comparesEqual((QString *)
                              (pSVar1[uVar4].entries
                               [pSVar1[uVar4].offsets[(uint)local_28.bucket & 0x7f]].storage.data +
                              8),value);
      if (bVar2) {
        pEVar3 = (local_28.d)->spans[local_28.bucket >> 7].entries +
                 (local_28.d)->spans[local_28.bucket >> 7].offsets[(uint)local_28.bucket & 0x7f];
        goto LAB_0029cee5;
      }
      QHashPrivate::iterator<QHashPrivate::Node<QObject_*,_QString>_>::operator++(&local_28);
    }
  }
  pEVar3 = (Entry *)0x0;
LAB_0029cee5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QObject **)pEVar3;
  }
  __stack_chk_fail();
}

Assistant:

const Key *keyImpl(const T &value) const noexcept
    {
        if (d) {
            const_iterator i = begin();
            while (i != end()) {
                if (i.value() == value)
                    return &i.key();
                ++i;
            }
        }

        return nullptr;
    }